

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

string * __thiscall
google::protobuf::FieldDescriptor::FieldTypeNameDebugString_abi_cxx11_
          (string *__return_storage_ptr__,FieldDescriptor *this)

{
  once_flag *__once;
  long lVar1;
  FieldDescriptor *local_20;
  FieldDescriptor *local_18;
  
  if (*(once_flag **)(this + 0x30) != (once_flag *)0x0) {
    local_20 = (FieldDescriptor *)TypeOnceInit;
    local_18 = this;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(this + 0x30),(_func_void_FieldDescriptor_ptr **)&local_20,&local_18);
  }
  __once = *(once_flag **)(this + 0x30);
  if (*(int *)(this + 0x38) == 0xe) {
    if (__once != (once_flag *)0x0) {
      local_20 = this;
      std::
      call_once<void(&)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (__once,TypeOnceInit,&local_20);
    }
    lVar1 = *(long *)(this + 0x70);
  }
  else {
    if (*(int *)(this + 0x38) != 0xb) {
      if (__once != (once_flag *)0x0) {
        local_20 = (FieldDescriptor *)TypeOnceInit;
        local_18 = this;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (__once,(_func_void_FieldDescriptor_ptr **)&local_20,&local_18);
      }
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,
                 *(char **)(kTypeToName + (ulong)*(uint *)(this + 0x38) * 8),(allocator *)&local_20)
      ;
      return __return_storage_ptr__;
    }
    if (__once != (once_flag *)0x0) {
      local_20 = this;
      std::
      call_once<void(&)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (__once,TypeOnceInit,&local_20);
    }
    lVar1 = *(long *)(this + 0x68);
  }
  std::operator+(__return_storage_ptr__,".",
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(lVar1 + 8))
  ;
  return __return_storage_ptr__;
}

Assistant:

std::string FieldDescriptor::FieldTypeNameDebugString() const {
  switch (type()) {
    case TYPE_MESSAGE:
      return "." + message_type()->full_name();
    case TYPE_ENUM:
      return "." + enum_type()->full_name();
    default:
      return kTypeToName[type()];
  }
}